

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QList<QGraphicsItem_*> * __thiscall
QGraphicsItem::childItems(QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  Data *pDVar2;
  
  QGraphicsItemPrivate::ensureSortedChildren((this->d_ptr).d);
  pQVar1 = (this->d_ptr).d;
  pDVar2 = (pQVar1->children).d.d;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = (pQVar1->children).d.ptr;
  (__return_storage_ptr__->d).size = (pQVar1->children).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QGraphicsItem *> QGraphicsItem::childItems() const
{
    const_cast<QGraphicsItem *>(this)->d_ptr->ensureSortedChildren();
    return d_ptr->children;
}